

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall wasm::DataFlow::Graph::doVisitBlock(Graph *this,Block *curr)

{
  mapped_type pEVar1;
  ArenaVector<wasm::Expression_*> *pAVar2;
  mapped_type *ppEVar3;
  Expression **ppEVar4;
  iterator iVar5;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  pEVar1 = this->parent;
  local_48 = (undefined1  [8])curr;
  ppEVar3 = std::__detail::
            _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->expressionParentMap,(key_type *)local_48);
  *ppEVar3 = pEVar1;
  this->parent = (Expression *)curr;
  __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  pAVar2 = (ArenaVector<wasm::Expression_*> *)
           (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
           usedElements;
  local_48 = (undefined1  [8])&curr->list;
  __begin2.index = (size_t)pEVar1;
  while ((__begin2.parent != pAVar2 || (local_48 != (undefined1  [8])&curr->list))) {
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)local_48);
    Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
              ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,*ppEVar4);
    __begin2.parent =
         (ArenaVector<wasm::Expression_*> *)
         ((long)&((__begin2.parent)->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data +
         1);
  }
  if ((curr->name).super_IString.str._M_str != (char *)0x0) {
    iVar5 = std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->breakStates)._M_h,&curr->name);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      if ((this->locals).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->locals).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
        ::push_back((vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
                     *)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_true>
                              ._M_cur + 0x18),&this->locals);
      }
      mergeBlock(this,(vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
                       *)((long)iVar5.
                                super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_true>
                                ._M_cur + 0x18),&this->locals);
    }
  }
  this->parent = (Expression *)__begin2.index;
  return &this->bad;
}

Assistant:

Node* doVisitBlock(Block* curr) {
    // TODO: handle super-deep nesting
    auto* oldParent = parent;
    expressionParentMap[curr] = oldParent;
    parent = curr;
    for (auto* child : curr->list) {
      visit(child);
    }
    // Merge the outputs
    // TODO handle conditions on these breaks
    if (curr->name.is()) {
      auto iter = breakStates.find(curr->name);
      if (iter != breakStates.end()) {
        auto& states = iter->second;
        // Add the state flowing out
        if (!isInUnreachable()) {
          states.push_back(locals);
        }
        mergeBlock(states, locals);
      }
    }
    parent = oldParent;
    return &bad;
  }